

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3io.c
# Opt level: O0

int wr_bin_hdr(FILE *fp)

{
  int iVar1;
  int32 iVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  int ret;
  long padding;
  uint32 i;
  FILE *fp_local;
  
  iVar1 = fprintf((FILE *)fp,"s3\n");
  if (iVar1 == 3) {
    for (padding._4_4_ = 0; attrib[padding._4_4_] != (char *)0x0; padding._4_4_ = padding._4_4_ + 1)
    {
      iVar1 = fprintf((FILE *)fp,"%s %s\n",attrib[padding._4_4_],value[padding._4_4_]);
      sVar3 = strlen(attrib[padding._4_4_]);
      sVar4 = strlen(value[padding._4_4_]);
      if ((long)iVar1 != sVar3 + sVar4 + 2) {
        err_msg_system(ERR_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3io.c"
                       ,0xd2,"Error while attrib/value pair\n");
        return -1;
      }
    }
    lVar5 = ftell((FILE *)fp);
    sVar3 = 8 - (lVar5 + 7U & 7);
    if (sVar3 != 8) {
      fwrite("        ",1,sVar3,(FILE *)fp);
    }
    iVar1 = fprintf((FILE *)fp,"endhdr\n");
    if (iVar1 == 7) {
      iVar2 = swap_stamp(fp);
      if (iVar2 == 0) {
        return 0;
      }
    }
    else {
      err_msg_system(ERR_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3io.c"
                     ,0xe1,"Error while endhdr marker\n");
    }
  }
  else {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3io.c"
                   ,0xca,"Error while writing SPHINX-III ID\n");
  }
  return -1;
}

Assistant:

static int
wr_bin_hdr(FILE *fp)
{
    uint32 i;
    long padding;
    int ret;

    if (fprintf(fp, "s3\n") != 3) {
	E_ERROR_SYSTEM("Error while writing SPHINX-III ID\n");
	goto error_loc;
    }

    for (i = 0; attrib[i]; i++) {
	ret = fprintf(fp, "%s %s\n", attrib[i], value[i]);
	if (ret != (strlen(attrib[i]) + 
		    strlen(value[i]) + 2)) {
	    E_ERROR_SYSTEM("Error while attrib/value pair\n");
	    goto error_loc;
	}
    }

    /* Align to an 8-byte boundary (guarantees natural alignment for
     * whatever follows) */
    padding = ftell(fp) + strlen("endhdr\n");
    padding = 8 - (padding & 7);
    if (padding != 8) {
	fwrite("        ", 1, padding, fp);
    }

    ret = fprintf(fp, "endhdr\n");
    if (ret != strlen("endhdr\n")) {
	E_ERROR_SYSTEM("Error while endhdr marker\n");
	goto error_loc;
    }

    if (swap_stamp(fp) != S3_SUCCESS) {
	goto error_loc;
    }

    return S3_SUCCESS;

error_loc:
    return S3_ERROR;
}